

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  MdParser *this;
  NcursesDisplayDriver *this_00;
  undefined *puVar2;
  undefined8 uVar3;
  string driver_string;
  MdlOptions op;
  ofstream output_file;
  string local_2d0;
  string local_2b0;
  MdlOptions local_290;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [14];
  ios_base local_130 [264];
  
  setlocale(6,"");
  MdlOptions::MdlOptions(&local_290,argc,argv);
  this = (MdParser *)operator_new(0x238);
  MdlOptions::input_file_abi_cxx11_((string *)local_228,&local_290);
  MdParser::MdParser(this,(string *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._0_8_ != local_218) {
    operator_delete((void *)local_228._0_8_,local_218[0]._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(local_228);
  MdlOptions::display_driver_abi_cxx11_(&local_2d0,&local_290);
  iVar1 = std::__cxx11::string::compare((char *)&local_2d0);
  if (iVar1 == 0) {
    this_00 = (NcursesDisplayDriver *)operator_new(0x10);
    DisplayDriver::DisplayDriver((DisplayDriver *)this_00,true);
    puVar2 = &PlainTextDisplayDriver::vtable;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_2d0);
    if (iVar1 == 0) {
      this_00 = (NcursesDisplayDriver *)operator_new(0x40);
      NcursesDisplayDriver::NcursesDisplayDriver(this_00);
      goto LAB_0011c05e;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_2d0);
    if (iVar1 == 0) {
      this_00 = (NcursesDisplayDriver *)operator_new(0x10);
      LaTeXDisplayDriver::LaTeXDisplayDriver((LaTeXDisplayDriver *)this_00,true);
      goto LAB_0011c05e;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_2d0);
    if (iVar1 == 0) {
      this_00 = (NcursesDisplayDriver *)operator_new(0x10);
      HtmlDisplayDriver::HtmlDisplayDriver((HtmlDisplayDriver *)this_00,true);
      goto LAB_0011c05e;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_2d0);
    if (iVar1 == 0) {
      this_00 = (NcursesDisplayDriver *)operator_new(0x10);
      DisplayDriver::DisplayDriver((DisplayDriver *)this_00,true);
      puVar2 = &TroffDisplayDriver::vtable;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_2d0);
      if (iVar1 == 0) {
        this_00 = (NcursesDisplayDriver *)operator_new(0x10);
        DisplayDriver::DisplayDriver((DisplayDriver *)this_00,true);
        puVar2 = &AnsiDisplayDriver::vtable;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_2d0);
        if (iVar1 == 0) {
          this_00 = (NcursesDisplayDriver *)operator_new(0x10);
          DisplayDriver::DisplayDriver((DisplayDriver *)this_00,true);
          puVar2 = &MdDisplayDriver::vtable;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_2d0);
          if (iVar1 != 0) {
            __assert_fail("driver",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dopsi[P]mdl/mdl/main.cpp"
                          ,0x2c,"int main(int, char **)");
          }
          this_00 = (NcursesDisplayDriver *)operator_new(0x10);
          DisplayDriver::DisplayDriver((DisplayDriver *)this_00,true);
          puVar2 = &RstDisplayDriver::vtable;
        }
      }
    }
  }
  *(undefined **)this_00 = puVar2 + 0x10;
LAB_0011c05e:
  MdlOptions::output_file_abi_cxx11_(&local_2b0,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_2b0._M_string_length == 0) {
    uVar3 = (**(code **)(*(long *)this + 0x10))(this);
    (**(code **)(*(long *)this_00 + 0x10))(this_00,uVar3);
  }
  else {
    MdlOptions::output_file_abi_cxx11_(&local_2b0,&local_290);
    std::ofstream::open((string *)local_228,(_Ios_Openmode)&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    uVar3 = (**(code **)(*(long *)this + 0x10))(this);
    (**(code **)(*(long *)this_00 + 0x18))(this_00,uVar3,local_228);
    std::ofstream::close();
  }
  (**(code **)(*(long *)this_00 + 8))(this_00);
  (**(code **)(*(long *)this + 8))(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  local_228._0_8_ = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18)) = _Parser;
  std::filebuf::~filebuf((filebuf *)(local_228 + 8));
  std::ios_base::~ios_base(local_130);
  MdlOptions::~MdlOptions(&local_290);
  return 0;
}

Assistant:

int main(int argc, char ** argv) {
	setlocale(LC_ALL, "");

	MdlOptions op(argc, argv);
	Parser *parser(new MdParser(op.input_file()));
	DisplayDriver *driver(nullptr);
	ofstream output_file;

	string driver_string(op.display_driver());
	if (driver_string == "plain") {
		driver = new PlainTextDisplayDriver();
	} else if (driver_string == "ncurses") {
		driver = new NcursesDisplayDriver();
	} else if (driver_string == "latex") {
		driver = new LaTeXDisplayDriver(true);
	} else if (driver_string == "html") {
		driver = new HtmlDisplayDriver(true);
	} else if (driver_string == "troff") {
		driver = new TroffDisplayDriver(true);
	} else if (driver_string == "ansi") {
		driver = new AnsiDisplayDriver();
	} else if (driver_string == "md") {
		driver = new MdDisplayDriver();
	} else if (driver_string == "rst") {
		driver = new RstDisplayDriver();
	}

	assert(driver);
	assert(parser);
	
	/*
	 * This code section is not used since there is only one parser at the moment.
	 *
	if (vm.count("input-parser")) {
		// Select parser
	} else {
		// Default: MD
	}*/

	if (!op.output_file().empty()) {
		output_file.open(op.output_file());
		driver->display(parser->get_document(), output_file);
		output_file.close();
	} else {
		driver->display(parser->get_document());
	}

	delete driver;
	delete parser;

	return 0;
}